

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O0

double deRoundEven(double a)

{
  double dVar1;
  double fract;
  double integer;
  double a_local;
  
  integer = a;
  dVar1 = modf(a,&fract);
  if ((ABS(dVar1) != 0.5) || (NAN(ABS(dVar1)))) {
    a_local = deRound(integer);
  }
  else {
    dVar1 = deRound(integer / 2.0);
    a_local = dVar1 * 2.0;
  }
  return a_local;
}

Assistant:

double deRoundEven (double a)
{
	double integer;
	double fract = modf(a, &integer);
	if (fabs(fract) == 0.5)
		return 2.0 * deRound(a / 2.0);
	return deRound(a);
}